

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_send_disc_full(udp_ep *ep,nng_sockaddr *sa,uint32_t param_3,uint32_t remote_id,uint32_t seq
                       ,udp_disc_reason reason)

{
  undefined1 local_3c [8];
  udp_sp_disc disc;
  udp_disc_reason reason_local;
  uint32_t seq_local;
  uint32_t remote_id_local;
  uint32_t local_id_local;
  nng_sockaddr *sa_local;
  udp_ep *ep_local;
  
  local_3c[0] = '\x01';
  local_3c[1] = '\x03';
  local_3c._2_2_ = ep->proto;
  disc.us_peer_id._0_2_ = (undefined2)reason;
  local_3c._4_4_ = param_3;
  disc._0_4_ = remote_id;
  disc.us_sender_id = seq;
  disc.us_sequence = reason;
  disc._16_4_ = seq;
  udp_queue_tx(ep,sa,(udp_sp_msg *)local_3c,(nni_msg *)0x0);
  return;
}

Assistant:

static void
udp_send_disc_full(udp_ep *ep, nng_sockaddr *sa, uint32_t local_id,
    uint32_t remote_id, uint32_t seq, udp_disc_reason reason)
{
	udp_sp_disc disc;

	disc.us_ver       = 0x1;
	disc.us_op_code   = OPCODE_DISC;
	disc.us_type      = ep->proto;
	disc.us_sender_id = local_id;
	disc.us_peer_id   = remote_id;
	disc.us_sequence  = seq;
	disc.us_reason    = (uint16_t) reason;
	udp_queue_tx(ep, sa, (void *) &disc, NULL);
}